

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void CreateFile(uint64_t Size)

{
  bool bVar1;
  ofstream fill;
  ofstream truncate;
  
  std::ofstream::ofstream(&truncate,(string *)&filename_abi_cxx11_,_S_out);
  std::ofstream::close();
  std::ofstream::ofstream(&fill,(string *)&filename_abi_cxx11_,_S_out);
  while (bVar1 = Size != 0, Size = Size - 1, bVar1) {
    std::operator<<((ostream *)&fill,"A");
  }
  std::ostream::flush();
  std::ofstream::~ofstream(&fill);
  std::ofstream::~ofstream(&truncate);
  return;
}

Assistant:

void CreateFile(uint64_t Size)
{
    std::ofstream truncate(filename);
    truncate.close();

    std::ofstream fill(filename);
    for(uint64_t i = 0; i<Size; i++)
        { fill << "A"; }
    fill.flush();
}